

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O2

REF_STATUS ref_dict_bcast(REF_DICT ref_dict,REF_MPI ref_mpi)

{
  size_t __size;
  REF_INT n_00;
  uint uVar1;
  undefined8 in_RAX;
  void *data;
  void *data_00;
  REF_INT RVar2;
  undefined8 uVar3;
  REF_INT RVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  undefined8 uStack_38;
  REF_INT n;
  
  if (ref_mpi->n < 2) {
    return 0;
  }
  uStack_38 = in_RAX;
  if (ref_mpi->id == 0) {
    uStack_38 = CONCAT44(ref_dict->n,(int)in_RAX);
  }
  uVar1 = ref_mpi_bcast(ref_mpi,&n,1,1);
  if (uVar1 == 0) {
    n_00 = n;
    if ((long)n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0xd7,
             "ref_dict_bcast","malloc keys of REF_INT negative");
      return 1;
    }
    __size = (long)n * 4;
    data = malloc(__size);
    if (data == (void *)0x0) {
      pcVar6 = "malloc keys of REF_INT NULL";
      uVar3 = 0xd7;
    }
    else {
      data_00 = malloc(__size);
      if (data_00 != (void *)0x0) {
        if (ref_mpi->id == 0) {
          uVar1 = ref_dict->n;
          RVar2 = -1;
          RVar4 = -1;
          if (0 < (int)uVar1) {
            RVar2 = *ref_dict->key;
            RVar4 = *ref_dict->value;
          }
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          for (lVar7 = 1; lVar7 - uVar5 != 1; lVar7 = lVar7 + 1) {
            *(REF_INT *)((long)data + lVar7 * 4 + -4) = RVar2;
            *(REF_INT *)((long)data_00 + lVar7 * 4 + -4) = RVar4;
            RVar4 = -1;
            RVar2 = -1;
            if ((int)lVar7 < (int)uVar1) {
              RVar2 = ref_dict->key[lVar7];
              RVar4 = ref_dict->value[lVar7];
            }
          }
        }
        uVar1 = ref_mpi_bcast(ref_mpi,data,n_00,1);
        if (uVar1 == 0) {
          uVar1 = ref_mpi_bcast(ref_mpi,data_00,n,1);
          if (uVar1 == 0) {
            if (ref_mpi->id == 0) {
LAB_001a2eac:
              free(data_00);
              free(data);
              return 0;
            }
            lVar7 = 0;
            do {
              if (n <= lVar7) goto LAB_001a2eac;
              uVar1 = ref_dict_store(ref_dict,*(REF_INT *)((long)data + lVar7 * 4),
                                     *(REF_INT *)((long)data_00 + lVar7 * 4));
              lVar7 = lVar7 + 1;
            } while (uVar1 == 0);
            pcVar6 = "store";
            uVar3 = 0xe3;
          }
          else {
            pcVar6 = "bcast values";
            uVar3 = 0xe0;
          }
        }
        else {
          pcVar6 = "bcast keys";
          uVar3 = 0xdf;
        }
        goto LAB_001a2c97;
      }
      pcVar6 = "malloc values of REF_INT NULL";
      uVar3 = 0xd8;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",uVar3,
           "ref_dict_bcast",pcVar6);
    uVar1 = 2;
  }
  else {
    pcVar6 = "bcast n";
    uVar3 = 0xd6;
LAB_001a2c97:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",uVar3,
           "ref_dict_bcast",(ulong)uVar1,pcVar6);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_dict_bcast(REF_DICT ref_dict, REF_MPI ref_mpi) {
  REF_INT n;
  REF_INT *keys, *values;
  REF_INT i, index, key, value;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  if (ref_mpi_once(ref_mpi)) {
    n = ref_dict_n(ref_dict);
  }
  RSS(ref_mpi_bcast(ref_mpi, &n, 1, REF_INT_TYPE), "bcast n");
  ref_malloc(keys, n, REF_INT);
  ref_malloc(values, n, REF_INT);
  if (ref_mpi_once(ref_mpi)) {
    each_ref_dict_key_value(ref_dict, index, key, value) {
      keys[index] = key;
      values[index] = value;
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, keys, n, REF_INT_TYPE), "bcast keys");
  RSS(ref_mpi_bcast(ref_mpi, values, n, REF_INT_TYPE), "bcast values");
  if (!ref_mpi_once(ref_mpi)) {
    for (i = 0; i < n; i++) {
      RSS(ref_dict_store(ref_dict, keys[i], values[i]), "store");
    }
  }
  ref_free(values);
  ref_free(keys);
  return REF_SUCCESS;
}